

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O0

bool __thiscall ON_Plane::IsValid(ON_Plane *this)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  undefined1 local_58 [8];
  ON_3dVector N;
  double tol;
  double x;
  ON_Plane *this_local;
  
  bVar1 = ON_PlaneEquation::IsValid(&this->plane_equation);
  if (bVar1) {
    dVar2 = ON_PlaneEquation::ValueAt(&this->plane_equation,this->origin);
    if (NAN(dVar2)) {
      this_local._7_1_ = false;
    }
    else {
      if (2.3283064365386963e-10 < ABS(dVar2)) {
        dVar3 = ON_3dPoint::MaximumCoordinate(&this->origin);
        N.z = ABS(dVar3) + ABS((this->plane_equation).d);
        if ((N.z <= 1000.0) || (bVar1 = ON_3dPoint::IsValid(&this->origin), !bVar1)) {
          return false;
        }
        N.z = N.z * 2.220446049250313e-15;
        if (N.z < ABS(dVar2)) {
          return false;
        }
      }
      bVar1 = ON_IsRightHandFrame(&this->xaxis,&this->yaxis,&this->zaxis);
      if (bVar1) {
        ON_PlaneEquation::UnitNormal((ON_3dVector *)local_58,&this->plane_equation);
        dVar2 = ON_DotProduct((ON_3dVector *)local_58,&this->zaxis);
        if (ABS(dVar2 - 1.0) <= 1.490116119385e-08) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Plane::IsValid() const
{
  if ( !plane_equation.IsValid() )
    return false;


  double x = plane_equation.ValueAt(origin);
  if (ON_IS_NAN(x))
    return false;

  if ( fabs(x) >  ON_ZERO_TOLERANCE )
  {
    double tol = fabs(origin.MaximumCoordinate()) + fabs(plane_equation.d);
    if ( tol > 1000.0 && origin.IsValid() )
    {
      // 8 September 2003 Chuck and Dale:
      //   Fixing discrepancy between optimized and debug behavior.
      //   In this case, the ON_ZERO_TOLERANCE test worked in release
      //   and failed in debug. The principal behind this fix is valid
      //   for release builds too.
      //   For large point coordinates or planes far from the origin,
      //   the best we can hope for is to kill the first 15 or so decimal
      //   places.
      tol *= (ON_EPSILON*10.0);
      if ( fabs(x) > tol )
        return false;
    }
    else
      return false;
  }

  if ( !ON_IsRightHandFrame( xaxis, yaxis, zaxis ) )
    return false;

  const ON_3dVector N = plane_equation.UnitNormal();
  x = ON_DotProduct( N, zaxis );
  if ( fabs(x-1.0) >  ON_SQRT_EPSILON )
    return false;

  return true;
}